

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManConstructQuantCubeFwd(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace)

{
  DdManager *pDVar1;
  abctime aVar2;
  int iVar3;
  DdNode *n;
  void *pvVar4;
  DdNode *pDVar5;
  int iVar6;
  
  pDVar1 = p->dd;
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  n = Cudd_ReadOne(pDVar1);
  Cudd_Ref(n);
  iVar6 = 0;
  while( true ) {
    if (pGroup->vIns->nSize <= iVar6) {
      iVar6 = 0;
      while( true ) {
        if (pGroup->vOuts->nSize <= iVar6) {
          Cudd_Deref(n);
          p->dd->TimeStop = aVar2;
          return n;
        }
        pvVar4 = Vec_PtrEntry(pGroup->vOuts,iVar6);
        iVar3 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
        if (iVar3 < iGrpPlace) break;
        pDVar5 = n;
        if (iVar3 <= iGrpPlace) {
          pDVar1 = p->dd;
          iVar3 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar4 + 0x24));
          pDVar5 = Cudd_bddIthVar(pDVar1,iVar3);
          pDVar5 = Cudd_bddAnd(p->dd,n,pDVar5);
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(p->dd,n);
        }
        iVar6 = iVar6 + 1;
        n = pDVar5;
      }
      __assert_fail("iGroupLast >= iGrpPlace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                    ,0xe2,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
    }
    pvVar4 = Vec_PtrEntry(pGroup->vIns,iVar6);
    iVar3 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
    if (iVar3 < iGrpPlace) break;
    pDVar5 = n;
    if (iVar3 <= iGrpPlace) {
      pDVar1 = p->dd;
      iVar3 = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar4 + 0x24));
      pDVar5 = Cudd_bddIthVar(pDVar1,iVar3);
      pDVar5 = Cudd_bddAnd(p->dd,n,pDVar5);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(p->dd,n);
    }
    iVar6 = iVar6 + 1;
    n = pDVar5;
  }
  __assert_fail("iGroupLast >= iGrpPlace",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                ,0xd8,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
}

Assistant:

DdNode * Llb_ManConstructQuantCubeFwd( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}